

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

BrandedDecl * __thiscall
capnp::compiler::BrandScope::interpretResolve
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,
          ResolveResult *result,Reader source)

{
  Reader brand_00;
  bool bVar1;
  BrandScope *pBVar2;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> *brand_01;
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar3;
  ResolvedParameter variable;
  BrandedDecl *p;
  undefined1 local_260 [8];
  NullableValue<capnp::compiler::BrandedDecl> _p380;
  ResolvedParameter *param;
  ResolvedDecl local_170;
  undefined1 local_110 [24];
  Disposer *pDStack_f8;
  BrandScope *local_f0;
  uint64_t uStack_e8;
  undefined8 local_e0;
  BrandedDecl *pBStack_d8;
  ResolvedDecl local_d0;
  undefined1 local_70 [24];
  Reader *brand;
  Reader *local_48;
  Reader *_brand371;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> scope;
  ResolvedDecl *decl;
  ResolveResult *result_local;
  Resolver *resolver_local;
  BrandScope *this_local;
  
  bVar1 = kj::
          OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
          ::is<capnp::compiler::Resolver::ResolvedDecl>(result);
  if (bVar1) {
    scope.ptr = (BrandScope *)
                kj::
                OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
                ::get<capnp::compiler::Resolver::ResolvedDecl>(result);
    pop((BrandScope *)&_brand371,(uint64_t)this);
    local_48 = kj::_::readMaybe<capnp::schema::Brand::Reader>
                         ((Maybe<capnp::schema::Brand::Reader> *)&(scope.ptr)->leafId);
    if (local_48 == (Reader *)0x0) {
      pBVar2 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                         ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&_brand371);
      push((BrandScope *)local_110,(uint64_t)pBVar2,
           (uint)((scope.ptr)->super_Refcounted).super_Disposer._vptr_Disposer);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator=
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&_brand371,
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_110);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_110);
    }
    else {
      local_70._16_8_ = local_48;
      pBVar2 = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator->
                         ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&_brand371);
      Resolver::ResolvedDecl::ResolvedDecl(&local_d0,(ResolvedDecl *)scope.ptr);
      capnp::schema::Brand::Reader::getScopes
                ((Reader *)(local_110 + 0x10),(Reader *)local_70._16_8_);
      brand_00.reader.capTable = (CapTableReader *)pDStack_f8;
      brand_00.reader.segment = (SegmentReader *)local_110._16_8_;
      brand_00.reader.ptr = (byte *)local_f0;
      brand_00.reader.elementCount = (undefined4)uStack_e8;
      brand_00.reader.step = uStack_e8._4_4_;
      brand_00.reader._32_8_ = local_e0;
      brand_00.reader._40_8_ = pBStack_d8;
      evaluateBrand((BrandScope *)local_70,(Resolver *)pBVar2,(ResolvedDecl *)resolver,brand_00,
                    (uint)&local_d0);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator=
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&_brand371,
                 (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_70);
      kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
                ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)local_70);
      Resolver::ResolvedDecl::~ResolvedDecl(&local_d0);
    }
    Resolver::ResolvedDecl::ResolvedDecl(&local_170,(ResolvedDecl *)scope.ptr);
    brand_01 = kj::mv<kj::Own<capnp::compiler::BrandScope,decltype(nullptr)>>
                         ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&_brand371);
    BrandedDecl::BrandedDecl(__return_storage_ptr__,&local_170,brand_01,source);
    Resolver::ResolvedDecl::~ResolvedDecl(&local_170);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&_brand371);
  }
  else {
    _p380.field_1._160_8_ =
         kj::
         OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
         ::get<capnp::compiler::Resolver::ResolvedParameter>(result);
    lookupParameter((Maybe<capnp::compiler::BrandedDecl> *)&p,this,resolver,
                    ((ResolvedParameter *)_p380.field_1._160_8_)->id,
                    ((ResolvedParameter *)_p380.field_1._160_8_)->index);
    other = kj::_::readMaybe<capnp::compiler::BrandedDecl>
                      ((Maybe<capnp::compiler::BrandedDecl> *)&p);
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_260,other);
    kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe((Maybe<capnp::compiler::BrandedDecl> *)&p);
    pBVar3 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_260);
    if (pBVar3 == (BrandedDecl *)0x0) {
      variable._12_4_ = 0;
      variable._0_12_ = *(undefined1 (*) [12])_p380.field_1._160_8_;
      BrandedDecl::BrandedDecl(__return_storage_ptr__,variable,source);
    }
    else {
      pBVar3 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                         ((NullableValue<capnp::compiler::BrandedDecl> *)local_260);
      BrandedDecl::BrandedDecl(__return_storage_ptr__,pBVar3);
    }
    kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
              ((NullableValue<capnp::compiler::BrandedDecl> *)local_260);
  }
  return __return_storage_ptr__;
}

Assistant:

BrandedDecl BrandScope::interpretResolve(
    Resolver& resolver, Resolver::ResolveResult& result, Expression::Reader source) {
  if (result.is<Resolver::ResolvedDecl>()) {
    auto& decl = result.get<Resolver::ResolvedDecl>();

    auto scope = pop(decl.scopeId);
    KJ_IF_SOME(brand, decl.brand) {
      scope = scope->evaluateBrand(resolver, decl, brand.getScopes());
    } else {
      scope = scope->push(decl.id, decl.genericParamCount);
    }

    return BrandedDecl(decl, kj::mv(scope), source);
  }